

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::initPrograms
          (ImageSupport *this,SourceCollections *programCollection)

{
  VkImageType VVar1;
  TextureChannelClass TVar2;
  TextureFormat TVar3;
  ostream *poVar4;
  char *pcVar5;
  char *__rhs;
  string imageType;
  string imageFormat;
  ostringstream mainSrc;
  ostringstream declSrc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [11];
  
  TVar3 = ::vk::mapVkFormat((this->m_resourceDesc).imageFormat);
  if (TVar3.order < ARGB) {
    pcVar5 = *(char **)(&DAT_00c0af20 + (ulong)(TVar3.order & sRGBA) * 8);
  }
  else {
    pcVar5 = (char *)0x0;
  }
  __rhs = (char *)0x0;
  switch(TVar3.type) {
  case SIGNED_INT8:
    __rhs = "8i";
    break;
  case SIGNED_INT16:
    __rhs = "16i";
    break;
  case SIGNED_INT32:
    __rhs = "32i";
    break;
  case UNSIGNED_INT8:
    __rhs = "8ui";
    break;
  case UNSIGNED_INT16:
    __rhs = "16ui";
    break;
  case UNSIGNED_INT24:
    break;
  case UNSIGNED_INT32:
    __rhs = "32ui";
    break;
  case HALF_FLOAT:
    __rhs = "16f";
    break;
  case FLOAT:
    __rhs = "32f";
    break;
  default:
    if (TVar3.type < UNORM_INT24) {
      (*(code *)(&DAT_009ed45c + *(int *)(&DAT_009ed45c + ((ulong)TVar3 >> 0x20) * 4)))();
      return;
    }
  }
  local_310[0]._M_dataplus._M_p = (pointer)&local_310[0].field_2;
  local_310[0]._M_string_length = 0;
  local_310[0].field_2._M_local_buf[0] = '\0';
  std::operator+(local_198,local_310,pcVar5);
  std::operator+(&local_370,local_198,__rhs);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_310);
  VVar1 = (this->m_resourceDesc).imageType;
  TVar3 = ::vk::mapVkFormat((this->m_resourceDesc).imageFormat);
  TVar2 = tcu::getTextureChannelClass(TVar3.type);
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar5 = "u";
  }
  else {
    TVar2 = tcu::getTextureChannelClass(TVar3.type);
    pcVar5 = "";
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      pcVar5 = "i";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,pcVar5,(allocator<char> *)local_310);
  if (VVar1 < VK_IMAGE_TYPE_LAST) {
    std::operator+(&local_390,local_198,&DAT_009eddf0 + *(int *)(&DAT_009eddf0 + (ulong)VVar1 * 4));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,(char *)0x0,(allocator<char> *)local_310);
  }
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar4 = std::operator<<((ostream *)local_198,"layout(set = 0, binding = 0, ");
  poVar4 = std::operator<<(poVar4,(string *)&local_370);
  poVar4 = std::operator<<(poVar4,") readonly  uniform ");
  poVar4 = std::operator<<(poVar4,(string *)&local_390);
  poVar4 = std::operator<<(poVar4," srcImg;\n");
  poVar4 = std::operator<<(poVar4,"layout(set = 0, binding = 1, ");
  poVar4 = std::operator<<(poVar4,(string *)&local_370);
  poVar4 = std::operator<<(poVar4,") writeonly uniform ");
  poVar4 = std::operator<<(poVar4,(string *)&local_390);
  std::operator<<(poVar4," dstImg;\n");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  VVar1 = (this->m_resourceDesc).imageType;
  if (VVar1 == VK_IMAGE_TYPE_3D) {
    poVar4 = std::operator<<((ostream *)local_310,"    for (int z = 0; z < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_resourceDesc).size.m_data[2]);
    poVar4 = std::operator<<(poVar4,"; ++z)\n");
    poVar4 = std::operator<<(poVar4,"    for (int y = 0; y < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_resourceDesc).size.m_data[1]);
    poVar4 = std::operator<<(poVar4,"; ++y)\n");
    poVar4 = std::operator<<(poVar4,"    for (int x = 0; x < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_resourceDesc).size.m_data[0]);
    poVar4 = std::operator<<(poVar4,"; ++x)\n");
    pcVar5 = "        imageStore(dstImg, ivec3(x, y, z), imageLoad(srcImg, ivec3(x, y, z)));\n";
  }
  else if (VVar1 == VK_IMAGE_TYPE_2D) {
    poVar4 = std::operator<<((ostream *)local_310,"    for (int y = 0; y < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_resourceDesc).size.m_data[1]);
    poVar4 = std::operator<<(poVar4,"; ++y)\n");
    poVar4 = std::operator<<(poVar4,"    for (int x = 0; x < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_resourceDesc).size.m_data[0]);
    poVar4 = std::operator<<(poVar4,"; ++x)\n");
    pcVar5 = "        imageStore(dstImg, ivec2(x, y), imageLoad(srcImg, ivec2(x, y)));\n";
  }
  else {
    if (VVar1 != VK_IMAGE_TYPE_1D) goto LAB_0075d67e;
    poVar4 = std::operator<<((ostream *)local_310,"    for (int x = 0; x < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->m_resourceDesc).size.m_data[0]);
    poVar4 = std::operator<<(poVar4,"; ++x)\n");
    pcVar5 = "        imageStore(dstImg, x, imageLoad(srcImg, x));\n";
  }
  std::operator<<(poVar4,pcVar5);
LAB_0075d67e:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  initPassthroughPrograms
            (programCollection,&this->m_shaderPrefix,&local_330,&local_350,this->m_stage);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		const std::string	imageFormat	= getShaderImageFormatQualifier(m_resourceDesc.imageFormat);
		const std::string	imageType	= getShaderImageType(m_resourceDesc.imageFormat, m_resourceDesc.imageType);

		std::ostringstream declSrc;
		declSrc << "layout(set = 0, binding = 0, " << imageFormat << ") readonly  uniform " << imageType << " srcImg;\n"
				<< "layout(set = 0, binding = 1, " << imageFormat << ") writeonly uniform " << imageType << " dstImg;\n";

		std::ostringstream mainSrc;
		if (m_resourceDesc.imageType == VK_IMAGE_TYPE_1D)
			mainSrc << "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, x, imageLoad(srcImg, x));\n";
		else if (m_resourceDesc.imageType == VK_IMAGE_TYPE_2D)
			mainSrc << "    for (int y = 0; y < " << m_resourceDesc.size.y() << "; ++y)\n"
					<< "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, ivec2(x, y), imageLoad(srcImg, ivec2(x, y)));\n";
		else if (m_resourceDesc.imageType == VK_IMAGE_TYPE_3D)
			mainSrc << "    for (int z = 0; z < " << m_resourceDesc.size.z() << "; ++z)\n"
					<< "    for (int y = 0; y < " << m_resourceDesc.size.y() << "; ++y)\n"
					<< "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, ivec3(x, y, z), imageLoad(srcImg, ivec3(x, y, z)));\n";
		else
			DE_ASSERT(0);

		initPassthroughPrograms(programCollection, m_shaderPrefix, declSrc.str(), mainSrc.str(), m_stage);
	}